

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset_wire_format.pb.cc
# Opt level: O3

void proto2_wireformat_unittest::TestMessageSet::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  ulong uVar1;
  
  if (from_msg == to_msg) {
    MergeImpl();
  }
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),(MessageLite *)_TestMessageSet_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar1 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar1 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestMessageSet::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMessageSet*>(&to_msg);
  auto& from = static_cast<const TestMessageSet&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_wireformat_unittest.TestMessageSet)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}